

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O3

string * gmlc::networking::getLocalExternalAddressV4(string *__return_storage_ptr__,string *server)

{
  undefined8 *puVar1;
  size_type sVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  undefined8 this;
  int family;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined1 *puVar6;
  ulong uVar7;
  long lVar8;
  undefined1 *puVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  bool bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  string sstring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  error_code ec;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  query query_server;
  resolver resolver;
  string local_270;
  string *local_250;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_238;
  string local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type sStack_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  error_code local_1e0;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1b0 [2];
  _Head_base<0UL,_asio::io_context_*,_false> local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  pointer pcStack_100;
  undefined1 local_f0 [48];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_f0._0_8_ = local_f0 + 0x10;
  AsioContextManager::getContextPointer((AsioContextManager *)local_1d0,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_1d0._0_8_ + 0x40));
  local_228._M_dataplus._M_p._0_4_ = 2;
  local_1c0._0_8_ = aaStack_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_f0,(protocol_type *)&local_228,server,
             (string *)local_1c0,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != aaStack_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(aaStack_1b0[0]._M_allocated_capacity + 1));
  }
  local_1e0._M_value = 0;
  local_1e0._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            ((results_type *)local_1c0,local_80.service_,&local_80.implementation_,
             (query_type *)local_f0,&local_1e0);
  this = local_1c0._8_8_;
  if (local_1e0._M_value == 0) {
    sVar2 = *(size_type *)local_1c0._0_8_;
    lVar8 = aaStack_1b0[0]._M_allocated_capacity * 0x60;
    local_1c0._4_4_ = *(undefined4 *)(sVar2 + 4 + lVar8);
    puVar1 = (undefined8 *)(sVar2 + 8 + lVar8);
    local_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar1;
    pcStack_100 = (pointer)puVar1[1];
    local_1c0[0] = *(short *)(sVar2 + lVar8) != 2;
    if ((bool)local_1c0[0]) {
      aaStack_1b0[0]._8_4_ = *(undefined4 *)(sVar2 + 0x18 + lVar8);
      local_1c0._4_4_ = 0;
      local_1c0._8_8_ = local_108;
      aaStack_1b0[0]._0_8_ = pcStack_100;
    }
    else {
      local_1c0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aaStack_1b0[0]._M_allocated_capacity = (pointer)0x0;
      aaStack_1b0[0]._8_4_ = 0;
    }
    local_1c0._1_3_ = 0;
    asio::ip::address::to_string_abi_cxx11_(&local_228,(address *)local_1c0);
    netif::getInterfaceAddresses_abi_cxx11_(&local_120,(netif *)0x2,family);
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_208._4_4_,2);
    asio::ip::host_name_abi_cxx11_();
    local_248._0_8_ = &aStack_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::tcp> *)local_1c0,(protocol_type *)&local_208,
               &local_270,(string *)local_248,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != &aStack_238) {
      operator_delete((void *)local_248._0_8_,aStack_238._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    asio::detail::resolver_service<asio::ip::tcp>::resolve
              ((results_type *)&local_270,local_80.service_,&local_80.implementation_,
               (query_type *)local_1c0,&local_1e0);
    sVar2 = local_270._M_string_length;
    _Var4._M_p = local_270._M_dataplus._M_p;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length;
    if (local_1e0._M_value == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        lVar8 = local_270.field_2._M_allocated_capacity * 0x60;
        uVar12 = local_270.field_2._M_allocated_capacity;
        local_250 = __return_storage_ptr__;
        while( true ) {
          uVar12 = uVar12 + 1;
          sVar3 = *(size_type *)_Var4._M_p;
          local_248._4_4_ = *(undefined4 *)(sVar3 + 4 + lVar8);
          puVar1 = (undefined8 *)(sVar3 + 8 + lVar8);
          local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar1;
          sStack_200 = puVar1[1];
          local_248[0] = *(short *)(sVar3 + lVar8) != 2;
          if ((bool)local_248[0]) {
            aStack_238._8_4_ = *(undefined4 *)(sVar3 + 0x18 + lVar8);
            local_248._4_4_ = 0;
            local_248._8_8_ = local_208;
            aStack_238._M_allocated_capacity = sStack_200;
          }
          else {
            local_248._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            aStack_238._M_allocated_capacity = 0;
            aStack_238._8_4_ = 0;
          }
          local_248._1_3_ = 0;
          asio::ip::address::to_string_abi_cxx11_(&local_270,(address *)local_248);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          if (uVar12 == ((long)(*(long *)(_Var4._M_p + 8) - *(size_type *)_Var4._M_p) >> 5) *
                        -0x5555555555555555) break;
          lVar8 = lVar8 + 0x60;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2);
        }
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __return_storage_ptr__ = local_250;
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_120);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_150,&local_1f8);
      prioritizeExternalAddresses
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_248,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_150);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_150);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      local_250 = (string *)
                  &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__)->field_2;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)
      ->_M_dataplus)._M_p = (pointer)local_250;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(size_type *)local_248._0_8_,
                 *(long *)(local_248._0_8_ + 8) + *(size_type *)local_248._0_8_);
      uVar12 = local_248._8_8_;
      uVar7 = 0;
      if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_string_length != 0 && local_228._M_string_length != 0) {
        uVar10 = 0;
        while (*(char *)(CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_)
                        + uVar10) ==
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->_M_dataplus)._M_p[uVar10]) {
          uVar7 = uVar10 + 1;
          if ((local_228._M_string_length - 1 == uVar10) ||
             (bVar13 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__)->_M_string_length - 1 == uVar10, uVar10 = uVar7,
             bVar13)) goto LAB_004065e4;
        }
        uVar7 = uVar10 & 0xffffffff;
      }
LAB_004065e4:
      if (local_248._0_8_ != local_248._8_8_) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
        do {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,paVar11->_M_allocated_capacity,
                     (&paVar11->_M_allocated_capacity)[1] + paVar11->_M_allocated_capacity);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && local_228._M_string_length != 0
             ) {
            puVar9 = (undefined1 *)0x0;
            while (puVar9[CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_
                                  )] == local_270._M_dataplus._M_p[(long)puVar9]) {
              puVar6 = puVar9 + 1;
              if (((undefined1 *)(local_228._M_string_length - 1) == puVar9) ||
                 (bVar13 = (undefined1 *)
                           ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (local_270._M_string_length + -0x10))->_M_weak_count + 3U) ==
                           puVar9, puVar9 = puVar6, bVar13)) goto LAB_00406669;
            }
            puVar6 = (undefined1 *)((ulong)puVar9 & 0xffffffff);
LAB_00406669:
            if (6 < (int)puVar6 && (int)uVar7 < (int)puVar6) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_270);
              uVar7 = (ulong)puVar6 & 0xffffffff;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar11->_M_allocated_capacity + 4);
        } while (paVar11 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar12);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
    }
    else {
      getLocalExternalAddressV4_abi_cxx11_();
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180[1]._0_8_ != &local_160) {
      operator_delete((void *)local_180[1]._0_8_,(ulong)(local_160._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_head_impl != local_180) {
      operator_delete(local_190._M_head_impl,local_180[0]._M_allocated_capacity + 1);
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_) !=
        &local_228.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_),
                      local_228.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    getLocalExternalAddressV4_abi_cxx11_();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  if ((element_type *)local_1d0._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLocalExternalAddressV4(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v4(), server, "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    asio::ip::tcp::endpoint servep = *it_server;

    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif

    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}